

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::SwiftCompilerShellCommand::executeExternalCommand
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  string *Str;
  bool *pbVar1;
  uint *this_00;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  BuildSystemDelegate *pBVar6;
  TaskInterface ti_00;
  int iVar7;
  ProcessStatus PVar8;
  BuildSystemImpl *pBVar9;
  raw_ostream *prVar10;
  _Any_data *p_Var11;
  _func_void *p_Var12;
  Style style;
  string *psVar13;
  SmallString<16U> *in;
  SmallString<16U> *in_00;
  SmallString<16U> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  SmallString<16U> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  SmallString<16U> *in_05;
  SmallString<16U> *in_06;
  long *plVar14;
  int __fd;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  StringRef outputFileMapPath_00;
  StringRef Filename;
  StringRef path;
  StringRef path_00;
  ArrayRef<llvm::StringRef> commandLine_00;
  void *in_stack_fffffffffffffcf8;
  SwiftCompilerShellCommand *pSVar18;
  SwiftCompilerShellCommand *pSVar19;
  raw_fd_ostream os;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  SmallString<16U> object;
  SmallString<16U> swiftDepsPath;
  SmallString<16U> partialModulePath;
  SmallString<16U> depsPath;
  StringRef sourceStem;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsFiles;
  TaskInterface ti_local;
  SmallString<16U> depsPath_1;
  StringRef objectDir;
  Child local_190;
  ulong local_188;
  StringRef local_178;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<16U> masterDepsPath;
  string local_128;
  SmallString<16U> data;
  SmallString<64U> outputFileMapPath;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  Twine local_70;
  error_code ec;
  Twine local_48;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  pbVar2 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->sourcesList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    plVar14 = *(long **)((long)system->impl + 8);
    pcVar15 = "no configured \'sources\'";
  }
  else {
    pbVar4 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->objectsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar5) {
      plVar14 = *(long **)((long)system->impl + 8);
      pcVar15 = "no configured \'objects\'";
    }
    else if ((this->moduleName)._M_string_length == 0) {
      plVar14 = *(long **)((long)system->impl + 8);
      pcVar15 = "no configured \'module-name\'";
    }
    else if ((this->tempsPath)._M_string_length == 0) {
      plVar14 = *(long **)((long)system->impl + 8);
      pcVar15 = "no configured \'temps-path\'";
    }
    else {
      if ((long)pbVar3 - (long)pbVar2 == (long)pbVar5 - (long)pbVar4) {
        Str = &this->tempsPath;
        pSVar18 = this;
        (**(code **)(**(long **)((long)system->impl + 0x10) + 0x18))();
        outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX =
             &outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>;
        outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size = 0;
        outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Capacity = 0x40;
        getOutputFileMapPath(this,(SmallVectorImpl<char> *)&outputFileMapPath);
        commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outputFileMapPath_00.Length._0_4_ =
             outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase.Size;
        outputFileMapPath_00.Data =
             (char *)outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        outputFileMapPath_00.Length._4_4_ = 0;
        constructCommandLineArgs(this,outputFileMapPath_00,&commandLine);
        depsFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        depsFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depsFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Filename.Length._0_4_ =
             outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
             super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
             super_SmallVectorBase.Size;
        Filename.Data =
             (char *)outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        local_178.Length =
             (size_t)outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        local_178.Data =
             (char *)outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        if ((long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->sourcesList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->objectsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("sourcesList.size() == objectsList.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                        ,0xad6,
                        "bool (anonymous namespace)::SwiftCompilerShellCommand::writeOutputFileMap(TaskInterface, StringRef, std::vector<std::string> &) const"
                       );
        }
        data.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX =
             &data.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
        data.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size = 0;
        data.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Capacity = 0x10;
        ec._M_value = 0;
        ec._M_cat = (error_category *)std::_V2::system_category();
        Filename.Length._4_4_ = 0;
        llvm::raw_fd_ostream::raw_fd_ostream(&os,Filename,&ec,F_Text);
        iVar7 = ec._M_value;
        if (ec._M_value == 0) {
          llvm::raw_ostream::operator<<((raw_ostream *)&os,"{\n");
          masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.BeginX =
               &masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
          masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.Size = 0;
          masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.Capacity = 0x10;
          llvm::Twine::Twine((Twine *)&depsPath,Str);
          llvm::Twine::Twine((Twine *)&object,"master.swiftdeps");
          psVar13 = (string *)&partialModulePath;
          llvm::Twine::Twine((Twine *)psVar13,"");
          llvm::Twine::Twine((Twine *)&swiftDepsPath,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&masterDepsPath,(Twine *)&depsPath,(Twine *)&object,
                     (Twine *)psVar13,(Twine *)&swiftDepsPath);
          llvm::raw_ostream::operator<<((raw_ostream *)&os,"  \"\": {\n");
          if (pSVar18->enableWholeModuleOptimization == true) {
            psVar13 = &pSVar18->moduleName;
            depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 &depsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
            depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size = 0;
            depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Capacity = 0x10;
            llvm::Twine::Twine((Twine *)&partialModulePath,Str);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &object,psVar13,".d");
            llvm::Twine::Twine((Twine *)&swiftDepsPath,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &object);
            llvm::Twine::Twine((Twine *)&depsPath_1,"");
            llvm::Twine::Twine((Twine *)&local_128,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&depsPath,(Twine *)&partialModulePath,
                       (Twine *)&swiftDepsPath,(Twine *)&depsPath_1,(Twine *)&local_128);
            std::__cxx11::string::_M_dispose();
            partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase._8_8_ =
                 depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                 0xffffffff;
            partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
            llvm::StringRef::str_abi_cxx11_((string *)&object,(StringRef *)&partialModulePath);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &depsFiles,(string *)&object);
            std::__cxx11::string::_M_dispose();
            object.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 &object.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
            object.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size = 0;
            object.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Capacity = 0x10;
            llvm::Twine::Twine((Twine *)&swiftDepsPath,Str);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &partialModulePath,psVar13,".o");
            llvm::Twine::Twine((Twine *)&depsPath_1,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &partialModulePath);
            psVar13 = &local_128;
            llvm::Twine::Twine((Twine *)psVar13,"");
            llvm::Twine::Twine((Twine *)&local_190,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&object,(Twine *)&swiftDepsPath,(Twine *)&depsPath_1
                       ,(Twine *)psVar13,(Twine *)&local_190);
            std::__cxx11::string::_M_dispose();
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"    \"dependencies\": \"");
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&partialModulePath,(basic *)&depsPath,in);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&partialModulePath);
            llvm::raw_ostream::operator<<(prVar10,"\",\n");
            std::__cxx11::string::_M_dispose();
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"    \"object\": \"");
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&partialModulePath,(basic *)&object,in_00);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&partialModulePath);
            llvm::raw_ostream::operator<<(prVar10,"\",\n");
            std::__cxx11::string::_M_dispose();
            llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&object);
            llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&depsPath);
          }
          prVar10 = llvm::raw_ostream::operator<<
                              ((raw_ostream *)&os,"    \"swift-dependencies\": \"");
          llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                    ((string *)&depsPath,(basic *)&masterDepsPath,in_01);
          prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&depsPath);
          llvm::raw_ostream::operator<<(prVar10,"\"\n");
          std::__cxx11::string::_M_dispose();
          llvm::raw_ostream::operator<<((raw_ostream *)&os,"  },\n");
          uVar17 = 1;
          while( true ) {
            style = (Style)psVar13;
            uVar16 = (ulong)((int)uVar17 - 1);
            pbVar2 = (pSVar18->sourcesList).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((long)(pSVar18->sourcesList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5 == uVar16)
            break;
            std::__cxx11::string::string((string *)&depsPath,(string *)(pbVar2 + uVar16));
            pSVar19 = pSVar18;
            std::__cxx11::string::string
                      ((string *)&object,
                       (string *)
                       ((pSVar18->objectsList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar16));
            path.Length = 2;
            path.Data = (char *)object.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                                super_SmallVectorTemplateBase<char,_true>.
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                _8_8_;
            objectDir = llvm::sys::path::parent_path
                                  ((path *)object.super_SmallVector<char,_16U>.
                                           super_SmallVectorImpl<char>.
                                           super_SmallVectorTemplateBase<char,_true>.
                                           super_SmallVectorTemplateCommon<char,_void>.
                                           super_SmallVectorBase.BeginX,path,style);
            path_00.Length = 2;
            path_00.Data = (char *)depsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>
                                   .super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   ._8_8_;
            sourceStem = llvm::sys::path::stem
                                   ((path *)depsPath.super_SmallVector<char,_16U>.
                                            super_SmallVectorImpl<char>.
                                            super_SmallVectorTemplateBase<char,_true>.
                                            super_SmallVectorTemplateCommon<char,_void>.
                                            super_SmallVectorBase.BeginX,path_00,style);
            partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 &partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>
            ;
            partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size = 0;
            partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Capacity = 0x10;
            llvm::Twine::Twine((Twine *)&swiftDepsPath,&objectDir);
            llvm::Twine::Twine((Twine *)&depsPath_1,&sourceStem,"~partial.swiftmodule");
            llvm::Twine::Twine((Twine *)&local_128,"");
            llvm::Twine::Twine((Twine *)&local_190,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&partialModulePath,(Twine *)&swiftDepsPath,
                       (Twine *)&depsPath_1,(Twine *)&local_128,(Twine *)&local_190);
            swiftDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX =
                 &swiftDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
            swiftDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size = 0;
            swiftDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Capacity = 0x10;
            llvm::Twine::Twine((Twine *)&depsPath_1,&objectDir);
            llvm::Twine::Twine((Twine *)&local_128,&sourceStem,".swiftdeps");
            llvm::Twine::Twine((Twine *)&local_190,"");
            llvm::Twine::Twine(&local_70,"");
            llvm::sys::path::append
                      ((SmallVectorImpl<char> *)&swiftDepsPath,(Twine *)&depsPath_1,
                       (Twine *)&local_128,(Twine *)&local_190,&local_70);
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"  \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&depsPath_1,(basic *)&depsPath,in_02);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&depsPath_1);
            llvm::raw_ostream::operator<<(prVar10,"\": {\n");
            std::__cxx11::string::_M_dispose();
            pbVar1 = &pSVar18->enableWholeModuleOptimization;
            pSVar18 = pSVar19;
            if (*pbVar1 == false) {
              depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX =
                   &depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>;
              depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size = 0;
              depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Capacity = 0x10;
              llvm::Twine::Twine((Twine *)&local_128,&objectDir);
              llvm::Twine::Twine((Twine *)&local_190,&sourceStem,".d");
              llvm::Twine::Twine(&local_70,"");
              llvm::Twine::Twine(&local_48,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&depsPath_1,(Twine *)&local_128,
                         (Twine *)&local_190,&local_70,&local_48);
              prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"    \"dependencies\": \"")
              ;
              llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                        (&local_128,(basic *)&depsPath_1,in_03);
              prVar10 = llvm::raw_ostream::operator<<(prVar10,&local_128);
              llvm::raw_ostream::operator<<(prVar10,"\",\n");
              std::__cxx11::string::_M_dispose();
              local_188 = depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                          0xffffffff;
              local_190.twine =
                   (Twine *)depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
              ;
              llvm::StringRef::str_abi_cxx11_(&local_128,(StringRef *)&local_190);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &depsFiles,&local_128);
              std::__cxx11::string::_M_dispose();
              llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&depsPath_1);
              pSVar18 = pSVar19;
            }
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"    \"object\": \"");
            llbuild::basic::escapeForJSON<std::__cxx11::string>
                      ((string *)&depsPath_1,(basic *)&object,in_04);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&depsPath_1);
            llvm::raw_ostream::operator<<(prVar10,"\",\n");
            std::__cxx11::string::_M_dispose();
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"    \"swiftmodule\": \"");
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&depsPath_1,(basic *)&partialModulePath,in_05);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&depsPath_1);
            llvm::raw_ostream::operator<<(prVar10,"\",\n");
            std::__cxx11::string::_M_dispose();
            prVar10 = llvm::raw_ostream::operator<<
                                ((raw_ostream *)&os,"    \"swift-dependencies\": \"");
            llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                      ((string *)&depsPath_1,(basic *)&swiftDepsPath,in_06);
            prVar10 = llvm::raw_ostream::operator<<(prVar10,(string *)&depsPath_1);
            llvm::raw_ostream::operator<<(prVar10,"\"\n");
            std::__cxx11::string::_M_dispose();
            prVar10 = llvm::raw_ostream::operator<<((raw_ostream *)&os,"  }");
            pcVar15 = "";
            psVar13 = (string *)0x1d8532;
            if (uVar17 < (ulong)((long)(pSVar18->sourcesList).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pSVar18->sourcesList).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              pcVar15 = ",";
            }
            prVar10 = llvm::raw_ostream::operator<<(prVar10,pcVar15);
            llvm::raw_ostream::operator<<(prVar10,"\n");
            llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&swiftDepsPath);
            llvm::SmallVectorImpl<char>::~SmallVectorImpl
                      ((SmallVectorImpl<char> *)&partialModulePath);
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            uVar17 = (ulong)((int)uVar17 + 1);
          }
          __fd = 0x1badd8;
          llvm::raw_ostream::operator<<((raw_ostream *)&os,"}\n");
          llvm::raw_fd_ostream::close(&os,__fd);
          llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&masterDepsPath);
        }
        else {
          ti_00.ctx = pSVar18;
          ti_00.impl = in_stack_fffffffffffffcf8;
          pBVar9 = getBuildSystem(ti_00);
          pBVar6 = pBVar9->delegate;
          llvm::StringRef::str_abi_cxx11_((string *)&object,&local_178);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &depsPath,"unable to create output file map: \'",(string *)&object);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &masterDepsPath,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &depsPath,"\'");
          (*pBVar6->_vptr_BuildSystemDelegate[0xb])
                    (pBVar6,pSVar18,
                     masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                     masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        llvm::raw_fd_ostream::~raw_fd_ostream(&os);
        llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&data);
        if (iVar7 == 0) {
          commandLine_00.Length =
               (long)commandLine.
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)commandLine.
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
          commandLine_00.Data =
               commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
          PVar8 = llbuild::core::TaskInterface::spawn(&ti_local,context,commandLine_00);
          if (PVar8 == Succeeded) {
            os._0_4_ = SUB84(pSVar18,0);
            os._4_4_ = SUB84((ulong)pSVar18 >> 0x20,0);
            os._8_4_ = SUB84(ti_local.impl,0);
            os._12_4_ = SUB84((ulong)ti_local.impl >> 0x20,0);
            os._16_8_ = ti_local.ctx;
            llvm::optional_detail::
            OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
            OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
                             *)&os.field_0x18,&completionFn->Storage);
            os.pos._0_4_ = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&os.SupportsSeeking,&depsFiles);
            local_90._8_8_ = 0;
            p_Var12 = (_func_void *)operator_new(0x60);
            *(ulong *)p_Var12 = CONCAT44(os._4_4_,os._0_4_);
            *(ulong *)(p_Var12 + 8) = CONCAT44(os._12_4_,os._8_4_);
            *(undefined8 *)(p_Var12 + 0x10) = os._16_8_;
            llvm::optional_detail::
            OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
            OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
                             *)(p_Var12 + 0x18),
                            (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
                             *)&os.field_0x18);
            *(undefined4 *)(p_Var12 + 0x40) = (undefined4)os.pos;
            *(undefined8 *)(p_Var12 + 0x48) = os._72_8_;
            *(undefined8 *)(p_Var12 + 0x50) = uStack_2a8;
            *(undefined8 *)(p_Var12 + 0x58) = local_2a0;
            os.SupportsSeeking = false;
            os._73_7_ = 0;
            local_78 = std::
                       _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3007:22)>
                       ::_M_invoke;
            local_80 = std::
                       _Function_handler<void_(llbuild::basic::QueueJobContext_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3007:22)>
                       ::_M_manager;
            this_00 = &data.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            data.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX = pSVar18;
            local_90._M_unused._0_8_ = (undefined8)p_Var12;
            std::function<void_(llbuild::basic::QueueJobContext_*)>::function
                      ((function<void_(llbuild::basic::QueueJobContext_*)> *)this_00,
                       (function<void_(llbuild::basic::QueueJobContext_*)> *)&local_90);
            llbuild::core::TaskInterface::spawn(&ti_local,(QueueJob *)&data,High);
            if (data.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts.
                _8_8_ != 0) {
              (*(code *)data.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                        InlineElts._8_8_)(this_00,this_00,3);
            }
            if (local_80 != (code *)0x0) {
              (*local_80)(&local_90,&local_90,__destroy_functor);
            }
            (anonymous_namespace)::SwiftCompilerShellCommand::
            executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
            ::{lambda(llbuild::basic::QueueJobContext*)#1}::~Optional
                      ((_lambda_llbuild__basic__QueueJobContext___1_ *)&os);
            goto LAB_0017f234;
          }
          if ((completionFn->Storage).hasVal != true) goto LAB_0017f234;
          p_Var11 = (_Any_data *)
                    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                              (completionFn);
          os._0_4_ = PVar8;
        }
        else {
          if ((completionFn->Storage).hasVal != true) goto LAB_0017f234;
          p_Var11 = (_Any_data *)
                    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                              (completionFn);
          os._0_4_ = 1;
        }
        os._8_4_ = 0xffffffff;
        os._4_4_ = 0xffffffff;
        os._32_4_ = 0;
        os.FD = 0;
        os._16_8_ = 0;
        os._24_8_ = 0;
        if (*(long *)(p_Var11 + 1) != 0) {
          (**(code **)((long)p_Var11 + 0x18))(p_Var11,(ProcessResult *)&os);
LAB_0017f234:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depsFiles);
          std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
                    (&commandLine.
                      super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
          llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&outputFileMapPath)
          ;
          return;
        }
        goto LAB_0017f260;
      }
      plVar14 = *(long **)((long)system->impl + 8);
      pcVar15 = "\'sources\' and \'objects\' are not the same size";
    }
  }
  outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  outputFileMapPath.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x0;
  llvm::Twine::Twine((Twine *)&os,pcVar15);
  (**(code **)(*plVar14 + 0x18))(plVar14,"",0,&outputFileMapPath,&os);
  if ((completionFn->Storage).hasVal == true) {
    p_Var11 = (_Any_data *)
              llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getPointer
                        (completionFn);
    os._0_4_ = 1;
    os._4_4_ = 0xffffffff;
    os._8_4_ = 0xffffffff;
    os._32_4_ = 0;
    os.FD = 0;
    os._16_8_ = 0;
    os._24_8_ = 0;
    if (*(long *)(p_Var11 + 1) == 0) {
LAB_0017f260:
      os._8_4_ = 0xffffffff;
      os._4_4_ = 0xffffffff;
      os._32_4_ = 0;
      os.FD = 0;
      os._24_8_ = 0;
      os._16_8_ = 0;
      std::__throw_bad_function_call();
    }
    (**(code **)((long)p_Var11 + 0x18))(p_Var11,(ProcessResult *)&os);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // FIXME: Need to add support for required parameters.
    if (sourcesList.empty()) {
      system.getDelegate().error("", {}, "no configured 'sources'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (objectsList.empty()) {
      system.getDelegate().error("", {}, "no configured 'objects'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (moduleName.empty()) {
      system.getDelegate().error("", {}, "no configured 'module-name'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (tempsPath.empty()) {
      system.getDelegate().error("", {}, "no configured 'temps-path'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    if (sourcesList.size() != objectsList.size()) {
      system.getDelegate().error(
          "", {}, "'sources' and 'objects' are not the same size");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Ensure the temporary directory exists.
    //
    // We ignore failures here, and just let things that depend on this fail.
    //
    // FIXME: This should really be done using an additional implicit input, so
    // it only happens once per build.
    (void) system.getFileSystem().createDirectories(tempsPath);
 
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    // Form the complete command.
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);

    // Write the output file map.
    std::vector<std::string> depsFiles;
    if (!writeOutputFileMap(ti, outputFileMapPath, depsFiles)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Execute the command.
    auto result = ti.spawn(context, commandLine);

    if (result != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Load all of the discovered dependencies.
    ti.spawn({ this, [this, ti, completionFn, result, depsFiles](QueueJobContext* context) mutable {
      for (const auto& depsPath: depsFiles) {
        if (!processDiscoveredDependencies(ti, depsPath)) {
          if (completionFn.hasValue())
            completionFn.getValue()(ProcessStatus::Failed);
          return;
        }
      }
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }}, basic::QueueJobPriority::High);
  }